

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_vdpu1.c
# Opt level: O1

MPP_RET hal_vp8d_vdpu1_init(void *hal,MppHalCfg *cfg)

{
  MppDev *ctx;
  MPP_RET MVar1;
  void *pvVar2;
  char *fmt;
  undefined8 uVar3;
  
  if (((byte)hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0x2e,
               "hal_vp8d_vdpu1_init");
  }
  ctx = (MppDev *)((long)hal + 0x10);
  MVar1 = mpp_dev_init(ctx,VPU_CLIENT_VDPU1);
  if (MVar1 == MPP_OK) {
    if (*(long *)((long)hal + 0x18) == 0) {
      pvVar2 = mpp_osal_calloc("hal_vp8d_vdpu1_init",0x194);
      *(void **)((long)hal + 0x18) = pvVar2;
      if (pvVar2 == (void *)0x0) {
        _mpp_log_l(2,"hal_vp8d_vdpu1","hal_vp8 reg alloc failed\n",(char *)0x0);
        MVar1 = MPP_ERR_MALLOC;
        goto LAB_002033d1;
      }
    }
    if (*(long *)((long)hal + 0x28) == 0) {
      MVar1 = mpp_buffer_group_get
                        ((MppBufferGroup *)((long)hal + 0x28),MPP_BUFFER_TYPE_ION,
                         MPP_BUFFER_INTERNAL,"hal_vp8d_vdpu1","hal_vp8d_vdpu1_init");
      if (MVar1 == MPP_OK) goto LAB_00203321;
      fmt = "hal_vp8 mpp_buffer_group_get failed\n";
    }
    else {
LAB_00203321:
      MVar1 = mpp_buffer_get_with_tag
                        (*(MppBufferGroup *)((long)hal + 0x28),(MppBuffer *)((long)hal + 0x30),
                         0x10000,"hal_vp8d_vdpu1","hal_vp8d_vdpu1_init");
      if (MVar1 == MPP_OK) {
        MVar1 = mpp_buffer_get_with_tag
                          (*(MppBufferGroup *)((long)hal + 0x28),(MppBuffer *)((long)hal + 0x38),
                           0xc00,"hal_vp8d_vdpu1","hal_vp8d_vdpu1_init");
        if (MVar1 == MPP_OK) {
          *(MppBufSlots *)hal = cfg->packet_slots;
          *(MppBufSlots *)((long)hal + 8) = cfg->frame_slots;
          cfg->dev = *(MppDev *)((long)hal + 0x10);
          uVar3 = 0x56;
          MVar1 = MPP_OK;
          goto LAB_00203458;
        }
        fmt = "hal_vp8 seg_map get buffer failed\n";
      }
      else {
        fmt = "hal_vp8 probe_table get buffer failed\n";
      }
    }
    _mpp_log_l(2,"hal_vp8d_vdpu1",fmt,(char *)0x0);
  }
  else {
    _mpp_log_l(2,"hal_vp8d_vdpu1","mpp_dev_init failed. ret: %d\n","hal_vp8d_vdpu1_init",
               (ulong)(uint)MVar1);
  }
LAB_002033d1:
  if (*ctx != (MppDev)0x0) {
    mpp_dev_deinit(*ctx);
    *ctx = (MppDev)0x0;
  }
  if (*(void **)((long)hal + 0x18) != (void *)0x0) {
    mpp_osal_free("hal_vp8d_vdpu1_init",*(void **)((long)hal + 0x18));
    *(undefined8 *)((long)hal + 0x18) = 0;
  }
  if (*(MppBuffer *)((long)hal + 0x30) != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x30),"hal_vp8d_vdpu1_init");
    *(undefined8 *)((long)hal + 0x30) = 0;
  }
  if (*(MppBufferGroup *)((long)hal + 0x38) != (MppBufferGroup)0x0) {
    mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x38));
    *(undefined8 *)((long)hal + 0x38) = 0;
  }
  if (*(MppBuffer *)((long)hal + 0x28) != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x28),"hal_vp8d_vdpu1_init");
    *(undefined8 *)((long)hal + 0x28) = 0;
  }
  uVar3 = 0x71;
LAB_00203458:
  if (((byte)hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"leave\n",uVar3,
               "hal_vp8d_vdpu1_init");
  }
  return MVar1;
}

Assistant:

MPP_RET hal_vp8d_vdpu1_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    VP8DHalContext_t *ctx = (VP8DHalContext_t *)hal;

    FUN_T("enter\n");

    ret = mpp_dev_init(&ctx->dev, VPU_CLIENT_VDPU1);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        goto ERR_RET;
    }
    if (NULL == ctx->regs) {
        ctx->regs = mpp_calloc_size(void, sizeof(VP8DRegSet_t));
        if (NULL == ctx->regs) {
            mpp_err("hal_vp8 reg alloc failed\n");
            ret = MPP_ERR_MALLOC;
            goto ERR_RET;
        }
    }

    if (NULL == ctx->group) {
        ret = mpp_buffer_group_get_internal(&ctx->group, MPP_BUFFER_TYPE_ION);
        if (ret) {
            mpp_err("hal_vp8 mpp_buffer_group_get failed\n");
            goto ERR_RET;
        }
    }

    ret = mpp_buffer_get(ctx->group, &ctx->probe_table, VP8D_PROB_TABLE_SIZE);
    if (ret) {
        mpp_err("hal_vp8 probe_table get buffer failed\n");
        goto ERR_RET;
    }

    ret = mpp_buffer_get(ctx->group, &ctx->seg_map, VP8D_MAX_SEGMAP_SIZE);
    if (ret) {
        mpp_err("hal_vp8 seg_map get buffer failed\n");
        goto ERR_RET;
    }
    //configure
    ctx->packet_slots   = cfg->packet_slots;
    ctx->frame_slots    = cfg->frame_slots;
    cfg->dev            = ctx->dev;

    FUN_T("leave\n");
    return ret;
ERR_RET:
    if (ctx->dev) {
        mpp_dev_deinit(ctx->dev);
        ctx->dev = NULL;
    }

    if (ctx->regs) {
        mpp_free(ctx->regs);
        ctx->regs = NULL;
    }

    if (ctx->probe_table) {
        mpp_buffer_put(ctx->probe_table);
        ctx->probe_table = NULL;
    }

    if (ctx->seg_map) {
        mpp_buffer_group_put(ctx->seg_map);
        ctx->seg_map = NULL;
    }

    if (ctx->group) {
        mpp_buffer_put(ctx->group);
        ctx->group = NULL;
    }
    FUN_T("leave\n");
    return ret;
}